

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

void __thiscall fp::Algorithm::~Algorithm(Algorithm *this)

{
  Algorithm *this_local;
  
  std::array<std::array<fp::Node,_16UL>,_16UL>::~array(&this->node_master_);
  std::array<std::array<fp::Node,_16UL>,_16UL>::~array(&this->node_info);
  std::
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  ::~stack(&this->path_stack_);
  std::shared_ptr<fp::LandBasedRobot>::~shared_ptr(&this->robot_);
  std::
  stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
  ::~stack(&this->stack_);
  return;
}

Assistant:

~Algorithm() = default;